

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O1

void maybe_free_watcher_list(watcher_list *w,uv_loop_t *loop)

{
  void **ppvVar1;
  watcher_list *pwVar2;
  int iVar3;
  undefined4 uVar4;
  watcher_list *pwVar5;
  watcher_list *pwVar6;
  watcher_list *pwVar7;
  watcher_list *pwVar8;
  watcher_list *old;
  int iVar9;
  void **ppvVar10;
  
  if ((w->iterating != 0) || (w->watchers != (void **)w->watchers[0])) {
    return;
  }
  ppvVar1 = &loop->inotify_watchers;
  pwVar7 = (w->entry).rbe_left;
  pwVar8 = (w->entry).rbe_right;
  pwVar5 = pwVar8;
  if ((pwVar7 == (watcher_list *)0x0) || (pwVar5 = pwVar7, pwVar8 == (watcher_list *)0x0)) {
    pwVar7 = (w->entry).rbe_parent;
    iVar9 = (w->entry).rbe_color;
    if (pwVar5 != (watcher_list *)0x0) {
      (pwVar5->entry).rbe_parent = pwVar7;
    }
    if (pwVar7 == (watcher_list *)0x0) {
      *ppvVar1 = pwVar5;
      pwVar7 = (watcher_list *)0x0;
    }
    else if ((pwVar7->entry).rbe_left == w) {
      (pwVar7->entry).rbe_left = pwVar5;
    }
    else {
      (pwVar7->entry).rbe_right = pwVar5;
    }
  }
  else {
    do {
      pwVar6 = pwVar8;
      pwVar8 = (pwVar6->entry).rbe_left;
    } while (pwVar8 != (watcher_list *)0x0);
    pwVar5 = (pwVar6->entry).rbe_right;
    pwVar7 = (pwVar6->entry).rbe_parent;
    iVar9 = (pwVar6->entry).rbe_color;
    if (pwVar5 != (watcher_list *)0x0) {
      (pwVar5->entry).rbe_parent = pwVar7;
    }
    ppvVar10 = ppvVar1;
    if (pwVar7 != (watcher_list *)0x0) {
      ppvVar10 = pwVar7->watchers + ((ulong)((pwVar7->entry).rbe_left != pwVar6) - 4);
    }
    *ppvVar10 = pwVar5;
    if ((pwVar6->entry).rbe_parent == w) {
      pwVar7 = pwVar6;
    }
    pwVar8 = (w->entry).rbe_left;
    pwVar2 = (w->entry).rbe_right;
    iVar3 = (w->entry).rbe_color;
    uVar4 = *(undefined4 *)&(w->entry).field_0x1c;
    (pwVar6->entry).rbe_parent = (w->entry).rbe_parent;
    (pwVar6->entry).rbe_color = iVar3;
    *(undefined4 *)&(pwVar6->entry).field_0x1c = uVar4;
    (pwVar6->entry).rbe_left = pwVar8;
    (pwVar6->entry).rbe_right = pwVar2;
    pwVar8 = (w->entry).rbe_parent;
    ppvVar10 = ppvVar1;
    if (pwVar8 != (watcher_list *)0x0) {
      ppvVar10 = pwVar8->watchers + ((ulong)((pwVar8->entry).rbe_left != w) - 4);
    }
    *ppvVar10 = pwVar6;
    (((w->entry).rbe_left)->entry).rbe_parent = pwVar6;
    pwVar8 = (w->entry).rbe_right;
    if (pwVar8 != (watcher_list *)0x0) {
      (pwVar8->entry).rbe_parent = pwVar6;
    }
  }
  if (iVar9 == 0) {
    do {
      if (((pwVar5 != (watcher_list *)0x0) && ((pwVar5->entry).rbe_color != 0)) ||
         (pwVar5 == (watcher_list *)*ppvVar1)) goto LAB_0010fa76;
      pwVar8 = (pwVar7->entry).rbe_left;
      if (pwVar8 == pwVar5) {
        pwVar8 = (pwVar7->entry).rbe_right;
        if ((pwVar8->entry).rbe_color == 1) {
          (pwVar8->entry).rbe_color = 0;
          (pwVar7->entry).rbe_color = 1;
          pwVar5 = (pwVar8->entry).rbe_left;
          (pwVar7->entry).rbe_right = pwVar5;
          if (pwVar5 != (watcher_list *)0x0) {
            (pwVar5->entry).rbe_parent = pwVar7;
          }
          pwVar5 = (pwVar7->entry).rbe_parent;
          (pwVar8->entry).rbe_parent = pwVar5;
          ppvVar10 = ppvVar1;
          if (pwVar5 != (watcher_list *)0x0) {
            pwVar5 = (pwVar7->entry).rbe_parent;
            ppvVar10 = pwVar5->watchers + ((ulong)(pwVar7 != (pwVar5->entry).rbe_left) - 4);
          }
          *ppvVar10 = pwVar8;
          (pwVar8->entry).rbe_left = pwVar7;
          (pwVar7->entry).rbe_parent = pwVar8;
          pwVar8 = (pwVar7->entry).rbe_right;
        }
        pwVar5 = (pwVar8->entry).rbe_left;
        if (((pwVar5 != (watcher_list *)0x0) && ((pwVar5->entry).rbe_color != 0)) ||
           ((pwVar6 = (pwVar8->entry).rbe_right, pwVar6 != (watcher_list *)0x0 &&
            ((pwVar6->entry).rbe_color != 0)))) {
          pwVar6 = (pwVar8->entry).rbe_right;
          if ((pwVar6 == (watcher_list *)0x0) || ((pwVar6->entry).rbe_color == 0)) {
            if (pwVar5 != (watcher_list *)0x0) {
              (pwVar5->entry).rbe_color = 0;
            }
            (pwVar8->entry).rbe_color = 1;
            pwVar6 = (pwVar5->entry).rbe_right;
            (pwVar8->entry).rbe_left = pwVar6;
            if (pwVar6 != (watcher_list *)0x0) {
              (pwVar6->entry).rbe_parent = pwVar8;
            }
            pwVar6 = (pwVar8->entry).rbe_parent;
            (pwVar5->entry).rbe_parent = pwVar6;
            ppvVar10 = ppvVar1;
            if (pwVar6 != (watcher_list *)0x0) {
              pwVar6 = (pwVar8->entry).rbe_parent;
              ppvVar10 = pwVar6->watchers + ((ulong)(pwVar8 != (pwVar6->entry).rbe_left) - 4);
            }
            *ppvVar10 = pwVar5;
            (pwVar5->entry).rbe_right = pwVar8;
            (pwVar8->entry).rbe_parent = pwVar5;
            pwVar8 = (pwVar7->entry).rbe_right;
          }
          (pwVar8->entry).rbe_color = (pwVar7->entry).rbe_color;
          (pwVar7->entry).rbe_color = 0;
          pwVar8 = (pwVar8->entry).rbe_right;
          if (pwVar8 != (watcher_list *)0x0) {
            (pwVar8->entry).rbe_color = 0;
          }
          pwVar8 = (pwVar7->entry).rbe_right;
          pwVar5 = (pwVar8->entry).rbe_left;
          (pwVar7->entry).rbe_right = pwVar5;
          if (pwVar5 != (watcher_list *)0x0) {
            (pwVar5->entry).rbe_parent = pwVar7;
          }
          pwVar5 = (pwVar7->entry).rbe_parent;
          (pwVar8->entry).rbe_parent = pwVar5;
          ppvVar10 = ppvVar1;
          if (pwVar5 != (watcher_list *)0x0) {
            pwVar5 = (pwVar7->entry).rbe_parent;
            ppvVar10 = pwVar5->watchers + ((ulong)(pwVar7 != (pwVar5->entry).rbe_left) - 4);
          }
          *ppvVar10 = pwVar8;
          (pwVar8->entry).rbe_left = pwVar7;
          goto LAB_0010fa6f;
        }
      }
      else {
        if ((pwVar8->entry).rbe_color == 1) {
          (pwVar8->entry).rbe_color = 0;
          (pwVar7->entry).rbe_color = 1;
          pwVar5 = (pwVar8->entry).rbe_right;
          (pwVar7->entry).rbe_left = pwVar5;
          if (pwVar5 != (watcher_list *)0x0) {
            (pwVar5->entry).rbe_parent = pwVar7;
          }
          pwVar5 = (pwVar7->entry).rbe_parent;
          (pwVar8->entry).rbe_parent = pwVar5;
          ppvVar10 = ppvVar1;
          if (pwVar5 != (watcher_list *)0x0) {
            pwVar5 = (pwVar7->entry).rbe_parent;
            ppvVar10 = pwVar5->watchers + ((ulong)(pwVar7 != (pwVar5->entry).rbe_left) - 4);
          }
          *ppvVar10 = pwVar8;
          (pwVar8->entry).rbe_right = pwVar7;
          (pwVar7->entry).rbe_parent = pwVar8;
          pwVar8 = (pwVar7->entry).rbe_left;
        }
        pwVar5 = (pwVar8->entry).rbe_left;
        if (((pwVar5 != (watcher_list *)0x0) && ((pwVar5->entry).rbe_color != 0)) ||
           ((pwVar6 = (pwVar8->entry).rbe_right, pwVar6 != (watcher_list *)0x0 &&
            ((pwVar6->entry).rbe_color != 0)))) goto LAB_0010f8f4;
      }
      (pwVar8->entry).rbe_color = 1;
      pwVar5 = pwVar7;
      pwVar7 = (pwVar7->entry).rbe_parent;
    } while( true );
  }
LAB_0010fa82:
  inotify_rm_watch(loop->inotify_fd,w->wd);
  uv__free(w);
  return;
LAB_0010f8f4:
  if ((pwVar5 == (watcher_list *)0x0) || ((pwVar5->entry).rbe_color == 0)) {
    pwVar5 = (pwVar8->entry).rbe_right;
    if (pwVar5 != (watcher_list *)0x0) {
      (pwVar5->entry).rbe_color = 0;
    }
    (pwVar8->entry).rbe_color = 1;
    pwVar6 = (pwVar5->entry).rbe_left;
    (pwVar8->entry).rbe_right = pwVar6;
    if (pwVar6 != (watcher_list *)0x0) {
      (pwVar6->entry).rbe_parent = pwVar8;
    }
    pwVar6 = (pwVar8->entry).rbe_parent;
    (pwVar5->entry).rbe_parent = pwVar6;
    ppvVar10 = ppvVar1;
    if (pwVar6 != (watcher_list *)0x0) {
      pwVar6 = (pwVar8->entry).rbe_parent;
      ppvVar10 = pwVar6->watchers + ((ulong)(pwVar8 != (pwVar6->entry).rbe_left) - 4);
    }
    *ppvVar10 = pwVar5;
    (pwVar5->entry).rbe_left = pwVar8;
    (pwVar8->entry).rbe_parent = pwVar5;
    pwVar8 = (pwVar7->entry).rbe_left;
  }
  (pwVar8->entry).rbe_color = (pwVar7->entry).rbe_color;
  (pwVar7->entry).rbe_color = 0;
  pwVar8 = (pwVar8->entry).rbe_left;
  if (pwVar8 != (watcher_list *)0x0) {
    (pwVar8->entry).rbe_color = 0;
  }
  pwVar8 = (pwVar7->entry).rbe_left;
  pwVar5 = (pwVar8->entry).rbe_right;
  (pwVar7->entry).rbe_left = pwVar5;
  if (pwVar5 != (watcher_list *)0x0) {
    (pwVar5->entry).rbe_parent = pwVar7;
  }
  pwVar5 = (pwVar7->entry).rbe_parent;
  (pwVar8->entry).rbe_parent = pwVar5;
  ppvVar10 = ppvVar1;
  if (pwVar5 != (watcher_list *)0x0) {
    pwVar5 = (pwVar7->entry).rbe_parent;
    ppvVar10 = pwVar5->watchers + ((ulong)(pwVar7 != (pwVar5->entry).rbe_left) - 4);
  }
  *ppvVar10 = pwVar8;
  (pwVar8->entry).rbe_right = pwVar7;
LAB_0010fa6f:
  (pwVar7->entry).rbe_parent = pwVar8;
  pwVar5 = (watcher_list *)*ppvVar1;
LAB_0010fa76:
  if (pwVar5 != (watcher_list *)0x0) {
    (pwVar5->entry).rbe_color = 0;
  }
  goto LAB_0010fa82;
}

Assistant:

static void maybe_free_watcher_list(struct watcher_list* w, uv_loop_t* loop) {
  /* if the watcher_list->watchers is being iterated over, we can't free it. */
  if ((!w->iterating) && QUEUE_EMPTY(&w->watchers)) {
    /* No watchers left for this path. Clean up. */
    RB_REMOVE(watcher_root, CAST(&loop->inotify_watchers), w);
    inotify_rm_watch(loop->inotify_fd, w->wd);
    uv__free(w);
  }
}